

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l10n.c
# Opt level: O2

int read_token(char *buffer,char *token,size_t len)

{
  char cVar1;
  char cVar2;
  ushort **ppuVar3;
  int iVar4;
  ulong uVar5;
  
  cVar1 = *buffer;
  uVar5 = 0;
  while( true ) {
    cVar2 = (buffer + (cVar1 == '{'))[uVar5];
    iVar4 = (int)(buffer + (cVar1 == '{'));
    if (((long)cVar2 == 0) || (0xf < uVar5)) break;
    if (cVar2 == '}') {
      iVar4 = iVar4 + (int)uVar5 + 1;
      goto LAB_00106c48;
    }
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[cVar2] & 8) == 0) break;
    token[uVar5] = cVar2;
    uVar5 = uVar5 + 1;
  }
  iVar4 = iVar4 + (int)uVar5;
LAB_00106c48:
  token[uVar5] = '\0';
  return iVar4 - (int)buffer;
}

Assistant:

static int read_token(const char *buffer, char *token, size_t len)
{
    char *po = token;
    const char *pi = buffer;
    if (*pi == '{') ++pi;
    while (*pi && po < token + len) {
        if (*pi == '}') {
            ++pi;
            break;
        }
        if (!isalnum(*pi)) {
            break;
        }
        *po++ = *pi++;
    }
    *po = '\0';
    return (int)(pi - buffer);
}